

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

void __thiscall KMaxDistance::printRec(KMaxDistance *this,char *heading,MaxRec *rec,int numDistMaxs)

{
  undefined4 in_ECX;
  long in_RDX;
  undefined8 in_RSI;
  KMaxDistance *in_RDI;
  double dVar1;
  double sum;
  double *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  printf("%s ",in_RSI);
  if (*(int *)(in_RDX + 0x10) != 0) {
    printVals((KMaxDistance *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
              (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    dVar1 = sumVals(in_RDI,(double *)(in_RDX + 0x38),*(int *)(in_RDX + 0x30));
    printf(" sum=%.3f (%.3f) isUsed=%d wasMin=%d imgIdx=%3d\n",dVar1,*(undefined8 *)(in_RDX + 0x28),
           (ulong)*(uint *)(in_RDX + 0x10),(ulong)*(uint *)(in_RDX + 0x14),
           (ulong)*(uint *)(in_RDX + 0x20));
  }
  return;
}

Assistant:

void KMaxDistance::printRec( const char *heading, MaxRec *rec, const int numDistMaxs ){
    printf( "%s ", heading );
    if ( rec->isUsed ){
        printVals( rec->vals, rec->numVals, numDistMaxs );
        double sum = sumVals( rec->vals, rec->numVals );
        printf( " sum=%.3f (%.3f) isUsed=%d wasMin=%d imgIdx=%3d\n", sum, rec->sumVals, rec->isUsed, rec->wasMin, rec->imgIdx );
    }
}